

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTimer.hpp
# Opt level: O0

void __thiscall Timer::Timer(Timer *this,function<void_()> *func,long *interval)

{
  long *interval_local;
  function<void_()> *func_local;
  Timer *this_local;
  
  std::function<void_()>::function(&this->m_func);
  std::thread::thread(&this->m_thread);
  this->m_running = false;
  std::function<void_()>::operator=(&this->m_func,func);
  this->m_interval = *interval;
  return;
}

Assistant:

Timer(std::function<void(void)> func, const long &interval) {
        m_func = func;
        m_interval = interval;
    }